

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessesRemove(cmsysProcess *cp)

{
  cmsysProcess **ppcVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  int local_24;
  undefined1 auStack_20 [4];
  int i;
  kwsysProcessInstances newProcesses;
  cmsysProcess *cp_local;
  
  ppcVar1 = kwsysProcesses.Processes;
  _auStack_20 = kwsysProcesses._0_8_;
  uVar2 = _auStack_20;
  newProcesses._0_8_ = kwsysProcesses.Processes;
  for (local_24 = 0;
      (auStack_20 = kwsysProcesses.Count, local_24 < (int)auStack_20 &&
      (kwsysProcesses.Processes[local_24] != cp)); local_24 = local_24 + 1) {
  }
  newProcesses.Processes = (cmsysProcess **)cp;
  if (local_24 < (int)auStack_20) {
    iVar3 = (int)auStack_20 + -1;
    _auStack_20 = CONCAT44(kwsysProcesses.Size,iVar3);
    for (; local_24 < iVar3; local_24 = local_24 + 1) {
      ppcVar1[local_24] = ppcVar1[local_24 + 1];
    }
    if (iVar3 == 0) {
      do {
        iVar3 = sigaction(0x11,(sigaction *)&kwsysProcessesOldSigChldAction,(sigaction *)0x0);
        bVar5 = false;
        if (iVar3 < 0) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
      } while (bVar5);
      _auStack_20 = _auStack_20 & 0xffffffff;
      free((void *)newProcesses._0_8_);
      newProcesses.Count = 0;
      newProcesses.Size = 0;
    }
    kwsysProcessesUpdate((kwsysProcessInstances *)auStack_20);
    uVar2 = _auStack_20;
  }
  _auStack_20 = uVar2;
  kwsysProcessCleanupDescriptor((int *)((long)newProcesses.Processes + 0x24));
  return;
}

Assistant:

static void kwsysProcessesRemove(kwsysProcess* cp)
{
  /* Attempt to remove the given signal pipe from the signal handler set.  */
  {
  /* Find the given process in the set.  */
  kwsysProcessInstances newProcesses = kwsysProcesses;
  int i;
  for(i=0; i < newProcesses.Count; ++i)
    {
    if(newProcesses.Processes[i] == cp)
      {
      break;
      }
    }
  if(i < newProcesses.Count)
    {
    /* Remove the process from the set.  */
    --newProcesses.Count;
    for(; i < newProcesses.Count; ++i)
      {
      newProcesses.Processes[i] = newProcesses.Processes[i+1];
      }

    /* If this was the last process, disable the signal handler.  */
    if(newProcesses.Count == 0)
      {
      /* Restore the SIGCHLD handler.  Repeat call until it is not
         interrupted.  */
      while((sigaction(SIGCHLD, &kwsysProcessesOldSigChldAction, 0) < 0) &&
            (errno == EINTR));

      /* Free the table of process pointers since it is now empty.
         This is safe because the signal handler has been removed.  */
      newProcesses.Size = 0;
      free(newProcesses.Processes);
      newProcesses.Processes = 0;
      }

    /* Store the new set in that seen by the signal handler.  */
    kwsysProcessesUpdate(&newProcesses);
    }
  }

  /* Close the pipe through which the signal handler may have notified
     the given process object that a child has exited.  */
  kwsysProcessCleanupDescriptor(&cp->SignalPipe);
}